

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_reporter.h
# Opt level: O3

void __thiscall bandit::detail::info_reporter::it_starting(info_reporter *this,char *desc)

{
  int *piVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  piVar1 = &(this->super_progress_reporter).specs_run_;
  *piVar1 = *piVar1 + 1;
  poVar2 = this->stm_;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_ * '\x02');
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
  pcVar5 = "\x1b[1;33m";
  pcVar6 = "";
  bVar7 = this->colorizer_->colors_enabled_ == false;
  if (bVar7) {
    pcVar5 = "";
  }
  lVar4 = 7;
  if (bVar7) {
    lVar4 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[ TEST ]",8);
  bVar7 = this->colorizer_->colors_enabled_;
  if (bVar7 != false) {
    pcVar6 = "\x1b[0m";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,(ulong)bVar7 << 2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," it ",4);
  if (desc == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(desc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,desc,sVar3);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  this->indentation_ = this->indentation_ + 1;
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_starting(const char *desc)
	{
		progress_reporter::it_starting(desc);
		stm_
		  << indent()
		  << colorizer_.yellow()
		  << "[ TEST ]"
		  << colorizer_.reset()
		  << " it " << desc;
		++indentation_;
		stm_.flush();
	}